

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O1

bool __thiscall
Inferences::ChoiceDefinitionISE::is_of_form_xfx
          (ChoiceDefinitionISE *this,Literal *lit,TermList x,TermList *f)

{
  bool bVar1;
  ulong uVar2;
  TermList head;
  TermStack local_48;
  TermList local_28;
  
  bVar1 = ApplicativeHelper::isBool
                    ((TermList)
                     (lit->super_Term)._args[*(uint *)&(lit->super_Term).field_0xc & 0xfffffff].
                     _content);
  local_48._cursor = (TermList *)0x0;
  local_48._end = (TermList *)0x0;
  local_48._capacity = 0;
  local_48._stack = (TermList *)0x0;
  local_28._content = 2;
  ApplicativeHelper::getHeadAndArgs
            ((TermList)
             (lit->super_Term)._args
             [(ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff) + ((ulong)!bVar1 - 1)].
             _content,&local_28,&local_48);
  if ((local_28._content == x._content) && ((long)local_48._cursor - (long)local_48._stack == 8)) {
    ApplicativeHelper::getHeadAndArgs((TermList)(local_48._stack)->_content,f,&local_48);
    if (((f->_content & 1) == 0) && ((long)local_48._cursor - (long)local_48._stack == 8)) {
      bVar1 = (local_48._stack)->_content == x._content;
      goto LAB_004fc841;
    }
  }
  bVar1 = false;
LAB_004fc841:
  if (local_48._stack != (TermList *)0x0) {
    uVar2 = local_48._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      (local_48._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_48._stack;
    }
    else if (uVar2 < 0x11) {
      (local_48._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_48._stack;
    }
    else if (uVar2 < 0x19) {
      (local_48._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_48._stack;
    }
    else if (uVar2 < 0x21) {
      (local_48._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_48._stack;
    }
    else if (uVar2 < 0x31) {
      (local_48._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_48._stack;
    }
    else if (uVar2 < 0x41) {
      (local_48._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_48._stack;
    }
    else {
      operator_delete(local_48._stack,0x10);
    }
  }
  return bVar1;
}

Assistant:

bool ChoiceDefinitionISE::is_of_form_xfx(Literal* lit, TermList x, TermList& f){
  TermList term = AH::isBool(*lit->nthArgument(0)) ? *lit->nthArgument(1) : *lit->nthArgument(0);
  
  TermStack args;
  TermList head;
  ApplicativeHelper::getHeadAndArgs(term, head, args);
  if(head == x && args.size() == 1){
    TermList arg = args[0];
    ApplicativeHelper::getHeadAndArgs(arg, f, args);
    return (!f.isVar() && args.size() == 1 && args[0] == x);
  }
  return false;
}